

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

uint32_t readHexNumber(void)

{
  bool bVar1;
  int local_14;
  int c;
  bool empty;
  uint32_t value;
  
  c = 0;
  bVar1 = true;
  do {
    local_14 = peek();
    if ((local_14 < 0x61) || (0x66 < local_14)) {
      if ((0x40 < local_14) && (local_14 < 0x47)) {
        local_14 = local_14 + -0x37;
        goto LAB_00111ffa;
      }
      if ((0x2f < local_14) && (local_14 < 0x3a)) {
        local_14 = local_14 + -0x30;
        goto LAB_00111ffa;
      }
      if ((local_14 != 0x5f) || (bVar1)) {
        if (bVar1) {
          error("Invalid integer constant, no digits after \'$\'\n");
        }
        return c;
      }
    }
    else {
      local_14 = local_14 + -0x57;
LAB_00111ffa:
      if (-local_14 - 1U >> 4 < (uint)c) {
        warning(WARNING_LARGE_CONSTANT,"Integer constant is too large\n");
      }
      c = c * 0x10 + local_14;
      bVar1 = false;
    }
    shiftChar();
  } while( true );
}

Assistant:

static uint32_t readHexNumber(void)
{
	uint32_t value = 0;
	bool empty = true;

	for (;; shiftChar()) {
		int c = peek();

		if (c >= 'a' && c <= 'f')
			c = c - 'a' + 10;
		else if (c >= 'A' && c <= 'F')
			c = c - 'A' + 10;
		else if (c >= '0' && c <= '9')
			c = c - '0';
		else if (c == '_' && !empty)
			continue;
		else
			break;

		if (value > (UINT32_MAX - c) / 16)
			warning(WARNING_LARGE_CONSTANT, "Integer constant is too large\n");
		value = value * 16 + c;

		empty = false;
	}

	if (empty)
		error("Invalid integer constant, no digits after '$'\n");

	return value;
}